

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O3

CURLcode Curl_ossl_certchain(Curl_easy *data,SSL *ssl)

{
  CURLcode CVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  stack_st_X509 *psVar5;
  BIO_METHOD *pBVar6;
  BIO *out;
  X509 *pXVar7;
  X509_NAME *pXVar8;
  size_t sVar9;
  undefined8 uVar10;
  ASN1_INTEGER *pAVar11;
  X509_PUBKEY *pub;
  X509_EXTENSION *ex;
  BIO *out_00;
  ASN1_OBJECT *pAVar12;
  ASN1_OCTET_STRING *v;
  ASN1_TIME *pAVar13;
  EVP_PKEY *pkey;
  int certnum;
  char *type;
  long lVar14;
  char *ptr;
  BUF_MEM *biomem;
  ASN1_OBJECT *pubkeyoid;
  X509_ALGOR *sigalg;
  ASN1_BIT_STRING *psig;
  BIGNUM *n;
  char *local_100;
  ASN1_OBJECT *local_f8;
  ASN1_OBJECT *local_f0;
  BIGNUM *local_e8;
  X509 *local_e0;
  int local_d4;
  int *local_d0;
  stack_st_X509 *local_c8;
  Curl_easy *local_c0;
  BIGNUM *local_b8 [17];
  
  psVar5 = SSL_get_peer_cert_chain((SSL *)ssl);
  CVar1 = CURLE_OUT_OF_MEMORY;
  if (psVar5 != (stack_st_X509 *)0x0) {
    local_d4 = OPENSSL_sk_num(psVar5);
    CVar1 = Curl_ssl_init_certinfo(data,local_d4);
    if (CVar1 == CURLE_OK) {
      pBVar6 = BIO_s_mem();
      out = BIO_new(pBVar6);
      CVar1 = CURLE_OUT_OF_MEMORY;
      if (out != (BIO *)0x0) {
        if (0 < local_d4) {
          certnum = 0;
          local_c8 = psVar5;
          local_c0 = data;
          do {
            pXVar7 = (X509 *)OPENSSL_sk_value(psVar5,certnum);
            local_d0 = (int *)0x0;
            pXVar8 = X509_get_subject_name(pXVar7);
            X509_NAME_print_ex(out,pXVar8,0,0x82031f);
            sVar9 = BIO_ctrl(out,3,0,&local_100);
            Curl_ssl_push_certinfo_len(data,certnum,"Subject",local_100,sVar9);
            BIO_ctrl(out,1,0,(void *)0x0);
            pXVar8 = X509_get_issuer_name(pXVar7);
            X509_NAME_print_ex(out,pXVar8,0,0x82031f);
            sVar9 = BIO_ctrl(out,3,0,&local_100);
            Curl_ssl_push_certinfo_len(data,certnum,"Issuer",local_100,sVar9);
            BIO_ctrl(out,1,0,(void *)0x0);
            uVar10 = X509_get_version(pXVar7);
            BIO_printf(out,"%lx",uVar10);
            sVar9 = BIO_ctrl(out,3,0,&local_100);
            Curl_ssl_push_certinfo_len(data,certnum,"Version",local_100,sVar9);
            BIO_ctrl(out,1,0,(void *)0x0);
            local_e0 = pXVar7;
            pAVar11 = X509_get_serialNumber(pXVar7);
            if (pAVar11->type == 0x102) {
              BIO_puts(out,"-");
            }
            if (0 < pAVar11->length) {
              lVar14 = 0;
              do {
                BIO_printf(out,"%02x",(ulong)pAVar11->data[lVar14]);
                lVar14 = lVar14 + 1;
              } while (lVar14 < pAVar11->length);
            }
            sVar9 = BIO_ctrl(out,3,0,&local_100);
            Curl_ssl_push_certinfo_len(data,certnum,"Serial Number",local_100,sVar9);
            BIO_ctrl(out,1,0,(void *)0x0);
            local_e8 = (BIGNUM *)0x0;
            local_f0 = (ASN1_OBJECT *)0x0;
            X509_get0_signature(&local_d0,&local_e8,local_e0);
            if (local_e8 != (BIGNUM *)0x0) {
              i2a_ASN1_OBJECT(out,(ASN1_OBJECT *)local_e8->d);
              sVar9 = BIO_ctrl(out,3,0,&local_100);
              Curl_ssl_push_certinfo_len(data,certnum,"Signature Algorithm",local_100,sVar9);
              BIO_ctrl(out,1,0,(void *)0x0);
            }
            pub = (X509_PUBKEY *)X509_get_X509_PUBKEY(local_e0);
            if ((pub != (X509_PUBKEY *)0x0) &&
               (X509_PUBKEY_get0_param(&local_f0,(uchar **)0x0,(int *)0x0,(X509_ALGOR **)0x0,pub),
               local_f0 != (ASN1_OBJECT *)0x0)) {
              i2a_ASN1_OBJECT(out,local_f0);
              sVar9 = BIO_ctrl(out,3,0,&local_100);
              Curl_ssl_push_certinfo_len(data,certnum,"Public Key Algorithm",local_100,sVar9);
              BIO_ctrl(out,1,0,(void *)0x0);
            }
            uVar10 = X509_get0_extensions(local_e0);
            iVar2 = OPENSSL_sk_num(uVar10);
            if ((0 < iVar2) && (iVar2 = OPENSSL_sk_num(uVar10), 0 < iVar2)) {
              iVar2 = 0;
              do {
                ex = (X509_EXTENSION *)OPENSSL_sk_value(uVar10,iVar2);
                pBVar6 = BIO_s_mem();
                out_00 = BIO_new(pBVar6);
                if (out_00 == (BIO *)0x0) break;
                pAVar12 = X509_EXTENSION_get_object(ex);
                i2t_ASN1_OBJECT((char *)local_b8,0x80,pAVar12);
                iVar3 = X509V3_EXT_print(out_00,ex,0,0);
                if (iVar3 == 0) {
                  v = X509_EXTENSION_get_data(ex);
                  ASN1_STRING_print(out_00,v);
                }
                BIO_ctrl(out_00,0x73,0,&local_f8);
                Curl_ssl_push_certinfo_len
                          (local_c0,certnum,(char *)local_b8,(char *)local_f8->ln,
                           (size_t)local_f8->sn);
                BIO_free(out_00);
                iVar2 = iVar2 + 1;
                iVar3 = OPENSSL_sk_num(uVar10);
              } while (iVar2 < iVar3);
            }
            pXVar7 = local_e0;
            pAVar13 = (ASN1_TIME *)X509_get0_notBefore(local_e0);
            ASN1_TIME_print(out,pAVar13);
            sVar9 = BIO_ctrl(out,3,0,&local_100);
            data = local_c0;
            Curl_ssl_push_certinfo_len(local_c0,certnum,"Start date",local_100,sVar9);
            BIO_ctrl(out,1,0,(void *)0x0);
            pAVar13 = (ASN1_TIME *)X509_get0_notAfter(pXVar7);
            ASN1_TIME_print(out,pAVar13);
            sVar9 = BIO_ctrl(out,3,0,&local_100);
            Curl_ssl_push_certinfo_len(data,certnum,"Expire date",local_100,sVar9);
            BIO_ctrl(out,1,0,(void *)0x0);
            pkey = X509_get_pubkey(pXVar7);
            if (pkey == (EVP_PKEY *)0x0) {
              Curl_infof(data,"   Unable to load public key");
            }
            else {
              iVar2 = EVP_PKEY_get_id(pkey);
              if (iVar2 == 0x74) {
                local_b8[0] = (BIGNUM *)0x0;
                local_f8 = (ASN1_OBJECT *)0x0;
                local_e8 = (BIGNUM *)0x0;
                local_f0 = (ASN1_OBJECT *)0x0;
                EVP_PKEY_get_bn_param(pkey,"p",local_b8);
                EVP_PKEY_get_bn_param(pkey,"q",&local_f8);
                EVP_PKEY_get_bn_param(pkey,"g",&local_e8);
                EVP_PKEY_get_bn_param(pkey,"pub",&local_f0);
                type = "dsa";
LAB_00140dcf:
                pubkey_show(data,(BIO *)out,certnum,type,"p",(BIGNUM *)local_b8[0]);
                pubkey_show(data,(BIO *)out,certnum,type,"q",(BIGNUM *)local_f8);
                pubkey_show(data,(BIO *)out,certnum,type,"g",(BIGNUM *)local_e8);
                pubkey_show(data,(BIO *)out,certnum,type,"pub_key",(BIGNUM *)local_f0);
                BN_clear_free(local_b8[0]);
                BN_clear_free((BIGNUM *)local_f8);
                BN_clear_free(local_e8);
                pAVar12 = local_f0;
LAB_00140e5a:
                BN_clear_free((BIGNUM *)pAVar12);
              }
              else {
                if (iVar2 == 0x1c) {
                  local_b8[0] = (BIGNUM *)0x0;
                  local_f8 = (ASN1_OBJECT *)0x0;
                  local_e8 = (BIGNUM *)0x0;
                  local_f0 = (ASN1_OBJECT *)0x0;
                  EVP_PKEY_get_bn_param(pkey,"p",local_b8);
                  EVP_PKEY_get_bn_param(pkey,"q",&local_f8);
                  EVP_PKEY_get_bn_param(pkey,"g",&local_e8);
                  EVP_PKEY_get_bn_param(pkey,"pub",&local_f0);
                  type = "dh";
                  goto LAB_00140dcf;
                }
                if (iVar2 == 6) {
                  local_b8[0] = (BIGNUM *)0x0;
                  local_f8 = (ASN1_OBJECT *)0x0;
                  EVP_PKEY_get_bn_param(pkey,"n",local_b8);
                  EVP_PKEY_get_bn_param(pkey,"e",&local_f8);
                  uVar4 = BN_num_bits(local_b8[0]);
                  BIO_printf(out,"%d",(ulong)uVar4);
                  sVar9 = BIO_ctrl(out,3,0,&local_100);
                  Curl_ssl_push_certinfo_len(data,certnum,"RSA Public Key",local_100,sVar9);
                  BIO_ctrl(out,1,0,(void *)0x0);
                  pubkey_show(data,(BIO *)out,certnum,"rsa","n",(BIGNUM *)local_b8[0]);
                  pubkey_show(data,(BIO *)out,certnum,"rsa","e",(BIGNUM *)local_f8);
                  BN_clear_free(local_b8[0]);
                  pAVar12 = local_f8;
                  goto LAB_00140e5a;
                }
              }
              EVP_PKEY_free(pkey);
            }
            if (local_d0 != (int *)0x0) {
              if (0 < *local_d0) {
                lVar14 = 0;
                do {
                  BIO_printf(out,"%02x:",(ulong)*(byte *)(*(long *)(local_d0 + 2) + lVar14));
                  lVar14 = lVar14 + 1;
                } while (lVar14 < *local_d0);
              }
              sVar9 = BIO_ctrl(out,3,0,&local_100);
              Curl_ssl_push_certinfo_len(data,certnum,"Signature",local_100,sVar9);
              BIO_ctrl(out,1,0,(void *)0x0);
            }
            psVar5 = local_c8;
            PEM_write_bio_X509(out,local_e0);
            sVar9 = BIO_ctrl(out,3,0,&local_100);
            Curl_ssl_push_certinfo_len(data,certnum,"Cert",local_100,sVar9);
            BIO_ctrl(out,1,0,(void *)0x0);
            certnum = certnum + 1;
          } while (certnum != local_d4);
        }
        BIO_free(out);
        CVar1 = CURLE_OK;
      }
    }
  }
  return CVar1;
}

Assistant:

CURLcode Curl_ossl_certchain(struct Curl_easy *data, SSL *ssl)
{
  CURLcode result;
  STACK_OF(X509) *sk;
  int i;
  numcert_t numcerts;
  BIO *mem;

  DEBUGASSERT(ssl);

  sk = SSL_get_peer_cert_chain(ssl);
  if(!sk) {
    return CURLE_OUT_OF_MEMORY;
  }

  numcerts = sk_X509_num(sk);

  result = Curl_ssl_init_certinfo(data, (int)numcerts);
  if(result) {
    return result;
  }

  mem = BIO_new(BIO_s_mem());
  if(!mem) {
    return CURLE_OUT_OF_MEMORY;
  }

  for(i = 0; i < (int)numcerts; i++) {
    ASN1_INTEGER *num;
    X509 *x = sk_X509_value(sk, i);
    EVP_PKEY *pubkey = NULL;
    int j;
    char *ptr;
    const ASN1_BIT_STRING *psig = NULL;

    X509_NAME_print_ex(mem, X509_get_subject_name(x), 0, XN_FLAG_ONELINE);
    push_certinfo("Subject", i);

    X509_NAME_print_ex(mem, X509_get_issuer_name(x), 0, XN_FLAG_ONELINE);
    push_certinfo("Issuer", i);

    BIO_printf(mem, "%lx", X509_get_version(x));
    push_certinfo("Version", i);

    num = X509_get_serialNumber(x);
    if(num->type == V_ASN1_NEG_INTEGER)
      BIO_puts(mem, "-");
    for(j = 0; j < num->length; j++)
      BIO_printf(mem, "%02x", num->data[j]);
    push_certinfo("Serial Number", i);

#if defined(HAVE_X509_GET0_SIGNATURE) && defined(HAVE_X509_GET0_EXTENSIONS)
    {
      const X509_ALGOR *sigalg = NULL;
      X509_PUBKEY *xpubkey = NULL;
      ASN1_OBJECT *pubkeyoid = NULL;

      X509_get0_signature(&psig, &sigalg, x);
      if(sigalg) {
        i2a_ASN1_OBJECT(mem, sigalg->algorithm);
        push_certinfo("Signature Algorithm", i);
      }

      xpubkey = X509_get_X509_PUBKEY(x);
      if(xpubkey) {
        X509_PUBKEY_get0_param(&pubkeyoid, NULL, NULL, NULL, xpubkey);
        if(pubkeyoid) {
          i2a_ASN1_OBJECT(mem, pubkeyoid);
          push_certinfo("Public Key Algorithm", i);
        }
      }

      X509V3_ext(data, i, X509_get0_extensions(x));
    }
#else
    {
      /* before OpenSSL 1.0.2 */
      X509_CINF *cinf = x->cert_info;

      i2a_ASN1_OBJECT(mem, cinf->signature->algorithm);
      push_certinfo("Signature Algorithm", i);

      i2a_ASN1_OBJECT(mem, cinf->key->algor->algorithm);
      push_certinfo("Public Key Algorithm", i);

      X509V3_ext(data, i, cinf->extensions);

      psig = x->signature;
    }
#endif

    ASN1_TIME_print(mem, X509_get0_notBefore(x));
    push_certinfo("Start date", i);

    ASN1_TIME_print(mem, X509_get0_notAfter(x));
    push_certinfo("Expire date", i);

    pubkey = X509_get_pubkey(x);
    if(!pubkey)
      infof(data, "   Unable to load public key");
    else {
      int pktype;
#ifdef HAVE_OPAQUE_EVP_PKEY
      pktype = EVP_PKEY_id(pubkey);
#else
      pktype = pubkey->type;
#endif
      switch(pktype) {
      case EVP_PKEY_RSA:
      {
#ifndef HAVE_EVP_PKEY_GET_PARAMS
        RSA *rsa;
#ifdef HAVE_OPAQUE_EVP_PKEY
        rsa = EVP_PKEY_get0_RSA(pubkey);
#else
        rsa = pubkey->pkey.rsa;
#endif /* HAVE_OPAQUE_EVP_PKEY */
#endif /* !HAVE_EVP_PKEY_GET_PARAMS */

        {
#ifdef HAVE_OPAQUE_RSA_DSA_DH
          DECLARE_PKEY_PARAM_BIGNUM(n);
          DECLARE_PKEY_PARAM_BIGNUM(e);
#ifdef HAVE_EVP_PKEY_GET_PARAMS
          EVP_PKEY_get_bn_param(pubkey, OSSL_PKEY_PARAM_RSA_N, &n);
          EVP_PKEY_get_bn_param(pubkey, OSSL_PKEY_PARAM_RSA_E, &e);
#else
          RSA_get0_key(rsa, &n, &e, NULL);
#endif /* HAVE_EVP_PKEY_GET_PARAMS */
          BIO_printf(mem, "%d", BN_num_bits(n));
#else
          BIO_printf(mem, "%d", BN_num_bits(rsa->n));
#endif /* HAVE_OPAQUE_RSA_DSA_DH */
          push_certinfo("RSA Public Key", i);
          print_pubkey_BN(rsa, n, i);
          print_pubkey_BN(rsa, e, i);
          FREE_PKEY_PARAM_BIGNUM(n);
          FREE_PKEY_PARAM_BIGNUM(e);
        }

        break;
      }
      case EVP_PKEY_DSA:
      {
#ifndef OPENSSL_NO_DSA
#ifndef HAVE_EVP_PKEY_GET_PARAMS
        DSA *dsa;
#ifdef HAVE_OPAQUE_EVP_PKEY
        dsa = EVP_PKEY_get0_DSA(pubkey);
#else
        dsa = pubkey->pkey.dsa;
#endif /* HAVE_OPAQUE_EVP_PKEY */
#endif /* !HAVE_EVP_PKEY_GET_PARAMS */
        {
#ifdef HAVE_OPAQUE_RSA_DSA_DH
          DECLARE_PKEY_PARAM_BIGNUM(p);
          DECLARE_PKEY_PARAM_BIGNUM(q);
          DECLARE_PKEY_PARAM_BIGNUM(g);
          DECLARE_PKEY_PARAM_BIGNUM(pub_key);
#ifdef HAVE_EVP_PKEY_GET_PARAMS
          EVP_PKEY_get_bn_param(pubkey, OSSL_PKEY_PARAM_FFC_P, &p);
          EVP_PKEY_get_bn_param(pubkey, OSSL_PKEY_PARAM_FFC_Q, &q);
          EVP_PKEY_get_bn_param(pubkey, OSSL_PKEY_PARAM_FFC_G, &g);
          EVP_PKEY_get_bn_param(pubkey, OSSL_PKEY_PARAM_PUB_KEY, &pub_key);
#else
          DSA_get0_pqg(dsa, &p, &q, &g);
          DSA_get0_key(dsa, &pub_key, NULL);
#endif /* HAVE_EVP_PKEY_GET_PARAMS */
#endif /* HAVE_OPAQUE_RSA_DSA_DH */
          print_pubkey_BN(dsa, p, i);
          print_pubkey_BN(dsa, q, i);
          print_pubkey_BN(dsa, g, i);
          print_pubkey_BN(dsa, pub_key, i);
          FREE_PKEY_PARAM_BIGNUM(p);
          FREE_PKEY_PARAM_BIGNUM(q);
          FREE_PKEY_PARAM_BIGNUM(g);
          FREE_PKEY_PARAM_BIGNUM(pub_key);
        }
#endif /* !OPENSSL_NO_DSA */
        break;
      }
      case EVP_PKEY_DH:
      {
#ifndef HAVE_EVP_PKEY_GET_PARAMS
        DH *dh;
#ifdef HAVE_OPAQUE_EVP_PKEY
        dh = EVP_PKEY_get0_DH(pubkey);
#else
        dh = pubkey->pkey.dh;
#endif /* HAVE_OPAQUE_EVP_PKEY */
#endif /* !HAVE_EVP_PKEY_GET_PARAMS */
        {
#ifdef HAVE_OPAQUE_RSA_DSA_DH
          DECLARE_PKEY_PARAM_BIGNUM(p);
          DECLARE_PKEY_PARAM_BIGNUM(q);
          DECLARE_PKEY_PARAM_BIGNUM(g);
          DECLARE_PKEY_PARAM_BIGNUM(pub_key);
#ifdef HAVE_EVP_PKEY_GET_PARAMS
          EVP_PKEY_get_bn_param(pubkey, OSSL_PKEY_PARAM_FFC_P, &p);
          EVP_PKEY_get_bn_param(pubkey, OSSL_PKEY_PARAM_FFC_Q, &q);
          EVP_PKEY_get_bn_param(pubkey, OSSL_PKEY_PARAM_FFC_G, &g);
          EVP_PKEY_get_bn_param(pubkey, OSSL_PKEY_PARAM_PUB_KEY, &pub_key);
#else
          DH_get0_pqg(dh, &p, &q, &g);
          DH_get0_key(dh, &pub_key, NULL);
#endif /* HAVE_EVP_PKEY_GET_PARAMS */
          print_pubkey_BN(dh, p, i);
          print_pubkey_BN(dh, q, i);
          print_pubkey_BN(dh, g, i);
#else
          print_pubkey_BN(dh, p, i);
          print_pubkey_BN(dh, g, i);
#endif /* HAVE_OPAQUE_RSA_DSA_DH */
          print_pubkey_BN(dh, pub_key, i);
          FREE_PKEY_PARAM_BIGNUM(p);
          FREE_PKEY_PARAM_BIGNUM(q);
          FREE_PKEY_PARAM_BIGNUM(g);
          FREE_PKEY_PARAM_BIGNUM(pub_key);
       }
        break;
      }
      }
      EVP_PKEY_free(pubkey);
    }

    if(psig) {
      for(j = 0; j < psig->length; j++)
        BIO_printf(mem, "%02x:", psig->data[j]);
      push_certinfo("Signature", i);
    }

    PEM_write_bio_X509(mem, x);
    push_certinfo("Cert", i);
  }

  BIO_free(mem);

  return CURLE_OK;
}